

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnLocalName
          (BinaryReaderIR *this,Index func_index,Index param_2,string_view name)

{
  string *orig_name;
  BindingHash *this_00;
  string_view in_stack_ffffffffffffff78;
  string local_68;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined8 uStack_34;
  Index local_28;
  
  orig_name = (string *)name.data_;
  if (name.size_ != 0) {
    this_00 = &(this->module_->funcs).
               super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
               super__Vector_impl_data._M_start[func_index]->bindings;
    (anonymous_namespace)::MakeDollarName_abi_cxx11_(in_stack_ffffffffffffff78);
    GetUniqueName(&local_68,(BinaryReaderIR *)this_00,(BindingHash *)&stack0xffffffffffffff78,
                  orig_name);
    uStack_38 = 0;
    uStack_34 = 0;
    local_48 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    local_28 = param_2;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)this_00,&local_68);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return (Result)Ok;
}

Assistant:

constexpr inline bool string_view::empty() const noexcept {
  return size_ == 0;
}